

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_callback.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  callback<void_()> c;
  callback<void_()> c2;
  string local_228 [32];
  callback<int_()> fcnt1;
  callback<void_(int)> fvi;
  callback<void_()> f;
  int x;
  callback<int_()> fcnt2;
  callback<int_()> fi;
  ostringstream oss;
  
  fooid_called = false;
  fooi_called = false;
  foov_called = false;
  booster::callback<void()>::callback<void(*)()>((callback<void()> *)&f,foov);
  booster::callback<void_()>::operator()(&f);
  if (foov_called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4a);
    std::operator<<(poVar2," foov_called");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_228);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::callback<void()>::operator=((callback<void()> *)&f,fooi);
  booster::callback<void_()>::operator()(&f);
  if (fooi_called == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4d);
    std::operator<<(poVar2," fooi_called");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_228);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::callback<int()>::callback<int(*)()>((callback<int()> *)&fi,fooi);
  iVar1 = booster::callback<int_()>::operator()(&fi);
  if (iVar1 != 10) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4f);
    std::operator<<(poVar2," fi()==10");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_228);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (fi.call_ptr.p_ == (callable<int_()> *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/function/test/test_callback.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x50);
    std::operator<<(poVar2," fi");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_228);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fvi.call_ptr.p_ = (pointer_type)(callable<void_(int)> *)0x0;
  booster::callback<void_(int)>::operator()(&fvi,10);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Not throws!");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	using booster::callback;
	try {
		reset();
		callback<void()> f=foov;
		f();
		TEST(foov_called);
		f=fooi;
		f();
		TEST(fooi_called);
		callback<int()> fi=fooi;
		TEST(fi()==10);
		TEST(fi);
		callback<void(int)> fvi;
		TEST(!fvi);
		try {
			fvi(10);
			throw std::runtime_error("Not throws!");
		}
		catch(booster::bad_callback_call const &e) {}
		fvi=fooid;
		TEST(fvi);
		fvi(10);
		TEST(fooid_called);
		int x=2;
		TEST(callback<int(int&)>(fooii)(x)==2);
		TEST(x==3);

		callback<int()> fcnt1=call_counter();
		callback<int()> fcnt2=fcnt1;
		TEST(fcnt1()==1);
		TEST(fcnt1()==2);
		TEST(fcnt2()==3);
		TEST(fcnt2()==4);

		{
			// move copy
			foov_called = false;
			callback<void()> c(foov);
			callback<void()> c2(std::move(c));
			TEST(c.empty());
			TEST(!c2.empty());
			c2();
			TEST(foov_called);
			foov_called=false;
		}
		{
			// move assignment
			foov_called = false;
			callback<void()> c(foov);
			callback<void()> c2(reset);
			TEST(!c.empty());
			TEST(!c2.empty());
			c2 = std::move(c);
			TEST(c.empty());
			TEST(!foov_called);
			c2();
			TEST(foov_called);
			foov_called=false;
		}
		
		{
			std::unique_ptr<mycall> mc(new mycall());
			callback<void()> f(std::move(mc));
			f();
			TEST(mycall_called); mycall_called=false;
		}
		{
			booster::intrusive_ptr<mycall> mc(new mycall());
			callback<void()> f(mc);
			f();
			TEST(mycall_called); mycall_called=false;
		}
		{
			std::unique_ptr<mycall> mc(new mycall());
			callback<void()> f;
			f=std::move(mc);
			f();
			TEST(mycall_called); mycall_called=false;
		}
		{
			booster::intrusive_ptr<mycall> mc(new mycall());
			callback<void()> f;
			f=mc;
			f();
			TEST(mycall_called); mycall_called=false;
		}
		{
			std::unique_ptr<myicall> mc(new myicall());
			callback<void(int)> f(std::move(mc));
			f(2);
			TEST(mycall_called); mycall_called=false;
		}
		{
			booster::intrusive_ptr<myicall> mc(new myicall());
			callback<void(int)> f(mc);
			f(2);
			TEST(mycall_called); mycall_called=false;
		}
		{
			std::unique_ptr<myicall> mc(new myicall());
			callback<void(int)> f;
			f=std::move(mc);
			f(2);
			TEST(mycall_called); mycall_called=false;
		}
		{
			booster::intrusive_ptr<myicall> mc(new myicall());
			callback<void(int)> f;
			f=mc;
			f(2);
			TEST(mycall_called); mycall_called=false;
		}


	}
	catch(std::exception const &e)
	{
		std::cout << "Fail"<< e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}